

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonetree.h
# Opt level: O1

void __thiscall
asmjit::v1_14::ZoneTree<asmjit::v1_14::AddressTableEntry>::
insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
          (ZoneTree<asmjit::v1_14::AddressTableEntry> *this,AddressTableEntry *node,
          Compare<(asmjit::v1_14::Support::SortOrder)0> *cmp)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  AddressTableEntry *pAVar7;
  ulong extraout_RAX;
  sbyte sVar8;
  AddressTableEntry *pAVar9;
  AddressTableEntry *pAVar10;
  uint uVar11;
  AddressTableEntry *pAVar12;
  byte *extraout_RDX;
  byte *extraout_RDX_00;
  OffsetFormat *format;
  byte *pbVar13;
  byte bVar14;
  AddressTableEntry *pAVar15;
  ulong uVar16;
  uint uVar17;
  byte *pbVar18;
  ulong uVar19;
  ulong *puVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ZoneTreeNode *save;
  bool bVar24;
  ZoneTreeNode head;
  ulong uStack_90;
  ulong uStack_88;
  AddressTableEntry *pAStack_80;
  code *pcStack_78;
  undefined8 local_48;
  AddressTableEntry *pAStack_40;
  
  if (*(ulong *)node < 2) {
    if (*(long *)(node + 8) != 0) goto LAB_00119f81;
    if (*(ulong *)node == 0) {
      pAVar10 = *(AddressTableEntry **)this;
      if (pAVar10 == (AddressTableEntry *)0x0) {
        *(AddressTableEntry **)this = node;
      }
      else {
        pAVar7 = (AddressTableEntry *)&local_48;
        local_48 = 0;
        pAStack_40 = pAVar10;
        *(undefined8 *)node = 1;
        pAVar12 = (AddressTableEntry *)0x0;
        uVar21 = 0;
        pAVar15 = (AddressTableEntry *)0x0;
        uVar16 = 0;
        while( true ) {
          if (pAVar10 == (AddressTableEntry *)0x0) {
            *(ulong *)(pAVar15 + uVar16 * 8) =
                 (ulong)((uint)*(undefined8 *)(pAVar15 + uVar16 * 8) & 1) | (ulong)node;
            pAVar9 = node;
          }
          else {
            pbVar18 = (byte *)(*(ulong *)pAVar10 & 0xfffffffffffffffe);
            pAVar9 = pAVar10;
            if ((((pbVar18 != (byte *)0x0) && ((*pbVar18 & 1) != 0)) &&
                (*(byte **)(pAVar10 + 8) != (byte *)0x0)) && ((**(byte **)(pAVar10 + 8) & 1) != 0))
            {
              *(ulong *)pAVar10 = *(ulong *)pAVar10 | 1;
              *pbVar18 = *pbVar18 & 0xfe;
              **(ulong **)(pAVar10 + 8) = **(ulong **)(pAVar10 + 8) & 0xfffffffffffffffe;
            }
          }
          if (((pAVar15 != (AddressTableEntry *)0x0) && ((*(ulong *)pAVar9 & 1) != 0)) &&
             (((byte)*pAVar15 & 1) != 0)) {
            pAVar10 = *(AddressTableEntry **)(pAVar7 + 8);
            uVar19 = (ulong)(uVar21 == 0);
            bVar24 = uVar21 != 0;
            uVar23 = (ulong)bVar24;
            pbVar18 = (byte *)(*(ulong *)(pAVar12 + uVar23 * 8) & 0xfffffffffffffffe);
            if (pAVar9 == (AddressTableEntry *)
                          (*(ulong *)(pAVar15 + uVar21 * 8) & 0xfffffffffffffffe)) {
              puVar20 = (ulong *)(pbVar18 + uVar19 * 8);
              uVar21 = (ulong)((uint)*(ulong *)(pAVar12 + uVar23 * 8) & 1) |
                       *puVar20 & 0xfffffffffffffffe;
            }
            else {
              pbVar13 = (byte *)(*(ulong *)(pbVar18 + (ulong)(uVar21 == 0) * 8) & 0xfffffffffffffffe
                                );
              uVar17 = (uint)bVar24 * 8;
              *(ulong *)(pbVar18 + (ulong)(uVar21 == 0) * 8) =
                   (ulong)((uint)*(ulong *)(pbVar18 + (ulong)(uVar21 == 0) * 8) & 1) |
                   *(ulong *)(pbVar13 + uVar17) & 0xfffffffffffffffe;
              *(ulong *)(pbVar13 + uVar17) =
                   (ulong)((uint)*(undefined8 *)(pbVar13 + uVar17) & 1) | (ulong)pbVar18;
              *pbVar18 = *pbVar18 | 1;
              *pbVar13 = *pbVar13 & 0xfe;
              uVar21 = (ulong)((uint)*(undefined8 *)(pAVar12 + uVar17) & 1);
              *(byte **)(pAVar12 + uVar17) = pbVar13 + uVar21;
              puVar20 = (ulong *)(pbVar13 + uVar19 * 8);
              uVar21 = *puVar20 & 0xfffffffffffffffe | uVar21;
              pbVar18 = pbVar13;
            }
            *(ulong *)(pAVar12 + uVar23 * 8) = uVar21;
            *puVar20 = (ulong)((uint)*puVar20 & 1) | (ulong)pAVar12;
            *pAVar12 = (AddressTableEntry)((byte)*pAVar12 | 1);
            *pbVar18 = *pbVar18 & 0xfe;
            *(ulong *)(pAVar7 + (ulong)(pAVar12 == pAVar10) * 8) =
                 (ulong)((uint)*(undefined8 *)(pAVar7 + (ulong)(pAVar12 == pAVar10) * 8) & 1) |
                 (ulong)pbVar18;
          }
          if (pAVar9 == node) break;
          if (pAVar12 != (AddressTableEntry *)0x0) {
            pAVar7 = pAVar12;
          }
          pAVar10 = (AddressTableEntry *)
                    (*(ulong *)(pAVar9 + (ulong)(*(ulong *)(pAVar9 + 0x10) < *(ulong *)(node + 0x10)
                                                ) * 8) & 0xfffffffffffffffe);
          pAVar12 = pAVar15;
          uVar21 = uVar16;
          pAVar15 = pAVar9;
          uVar16 = (ulong)(*(ulong *)(pAVar9 + 0x10) < *(ulong *)(node + 0x10));
        }
        *(AddressTableEntry **)this = pAStack_40;
        *pAStack_40 = (AddressTableEntry)((byte)*pAStack_40 & 0xfe);
      }
      return;
    }
  }
  else {
    insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
LAB_00119f81:
    insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
  }
  insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
  bVar1 = extraout_RDX[5];
  if (bVar1 == 0) {
    return;
  }
  bVar2 = extraout_RDX[3];
  uVar21 = (ulong)bVar2;
  if ((uint)bVar2 * 8 < (uint)bVar1) {
    return;
  }
  bVar3 = extraout_RDX[6];
  bVar4 = extraout_RDX[7];
  bVar5 = *extraout_RDX;
  bVar14 = (byte)(0x710 >> (bVar5 & 0x1f)) & bVar5 < 0xb;
  pAVar10 = (AddressTableEntry *)-(long)node;
  if (0 < (long)node) {
    pAVar10 = node;
  }
  if (bVar14 == 0) {
    pAVar10 = node;
  }
  if ((bVar5 != 1 & (bVar14 ^ 1)) == 0) {
    if (bVar4 != 0) {
      if (0x20 < bVar4) {
        pcStack_78 = (code *)0x11a302;
        CodeWriterUtils::encodeOffset32();
LAB_0011a302:
        pcStack_78 = CodeWriterUtils::encodeOffset64;
        CodeWriterUtils::encodeOffset32();
        bVar1 = extraout_RDX_00[5];
        if ((bVar1 != 0) && ((uint)bVar1 <= (uint)extraout_RDX_00[3] << 3)) {
          bVar2 = extraout_RDX_00[7];
          if (*extraout_RDX_00 == 1) {
            if (bVar2 != 0) {
              if (0x20 < bVar2) {
                pAStack_80 = (AddressTableEntry *)0x11a3d9;
                CodeWriterUtils::encodeOffset64();
LAB_0011a3d9:
                pAStack_80 = (AddressTableEntry *)CodeWriterUtils::writeOffset;
                CodeWriterUtils::encodeOffset64();
                if (format->_valueSize - 1 < 8) {
                  bVar1 = format->_valueOffset;
                  uStack_90 = extraout_RAX;
                  uStack_88 = uVar21;
                  pAStack_80 = pAVar10;
                  switch((uint)format->_valueSize) {
                  case 1:
                    bVar24 = CodeWriterUtils::encodeOffset32
                                       ((uint32_t *)&uStack_90,(int64_t)node,format);
                    if (bVar24) {
                      this[bVar1] = (ZoneTree<asmjit::v1_14::AddressTableEntry>)
                                    ((byte)this[bVar1] | (byte)uStack_90);
                    }
                    break;
                  case 2:
                    bVar24 = CodeWriterUtils::encodeOffset32
                                       ((uint32_t *)&uStack_90,(int64_t)node,format);
                    if (bVar24) {
                      *(ushort *)(this + bVar1) = *(ushort *)(this + bVar1) | (ushort)uStack_90;
                    }
                    break;
                  case 4:
                    bVar24 = CodeWriterUtils::encodeOffset32
                                       ((uint32_t *)&uStack_90,(int64_t)node,format);
                    if (bVar24) {
                      *(uint *)(this + bVar1) = *(uint *)(this + bVar1) | (uint)uStack_90;
                    }
                    break;
                  case 8:
                    bVar24 = CodeWriterUtils::encodeOffset64(&uStack_90,(int64_t)node,format);
                    if (bVar24) {
                      *(ulong *)(this + bVar1) = *(ulong *)(this + bVar1) | uStack_90;
                    }
                  }
                }
                return;
              }
              if ((((uint)(-1L << (bVar2 & 0x3f)) & 0xfffffffe ^ 0xffffffff) & (uint)node) != 0) {
                return;
              }
              node = (AddressTableEntry *)((ulong)node >> (bVar2 & 0x3f));
            }
            pAVar10 = (AddressTableEntry *)(0xffffffffffffffff >> (-bVar1 & 0x3f));
            if (pAVar10 < node) {
              return;
            }
            node = (AddressTableEntry *)((ulong)node & (ulong)pAVar10);
          }
          else {
            if (bVar2 != 0) {
              if (0x20 < bVar2) goto LAB_0011a3d9;
              if ((((uint)(-1L << (bVar2 & 0x3f)) & 0xfffffffe ^ 0xffffffff) & (uint)node) != 0) {
                return;
              }
              node = (AddressTableEntry *)((long)node >> (bVar2 & 0x3f));
            }
            if ((AddressTableEntry *)(((long)node << (-bVar1 & 0x3f)) >> (-bVar1 & 0x3f)) != node) {
              return;
            }
          }
          if (*extraout_RDX_00 < 2) {
            *(ulong *)this =
                 ((ulong)((long)node << (-bVar1 & 0x3f)) >> (-bVar1 & 0x3f)) <<
                 (extraout_RDX_00[6] & 0x3f);
          }
        }
        return;
      }
      if (((uint)pAVar10 & ((uint)(-1L << (bVar4 & 0x3f)) & 0xfffffffe ^ 0xffffffff)) != 0) {
        return;
      }
      pAVar10 = (AddressTableEntry *)((ulong)pAVar10 >> (bVar4 & 0x3f));
    }
    pAVar7 = (AddressTableEntry *)(ulong)(~(uint)(-1L << (bVar1 & 0x3f)) & (uint)pAVar10);
    if (pAVar10 != pAVar7) {
      return;
    }
  }
  else {
    if (bVar4 != 0) {
      if (0x20 < bVar4) goto LAB_0011a302;
      if (((uint)pAVar10 & ((uint)(-1L << (bVar4 & 0x3f)) & 0xfffffffe ^ 0xffffffff)) != 0) {
        return;
      }
      pAVar10 = (AddressTableEntry *)((long)pAVar10 >> (bVar4 & 0x3f));
    }
    iVar22 = (int)pAVar10;
    if ((AddressTableEntry *)(long)iVar22 != pAVar10) {
      return;
    }
    pAVar7 = (AddressTableEntry *)((ulong)pAVar10 & 0xffffffff);
    if ((iVar22 << (-bVar1 & 0x1f)) >> (-bVar1 & 0x1f) != iVar22) {
      return;
    }
  }
  uVar17 = (uint)pAVar7;
  if (0xb < bVar5) {
    return;
  }
  bVar14 = -1 < (long)node & bVar14;
  switch(bVar5) {
  default:
    uVar17 = (uVar17 & ~(uint)(-1L << (bVar1 & 0x3f))) << (bVar3 & 0x1f);
    break;
  case 2:
  case 3:
    if (bVar3 != 5) {
      return;
    }
    if (bVar1 != 0x15) {
      return;
    }
    if (bVar2 != 4) {
      return;
    }
    uVar17 = (uVar17 & 3) * 0x20000000 + (uVar17 & 0x1ffffc) * 8;
    break;
  case 4:
    if (bVar3 != 0) {
      return;
    }
    if (bVar1 != 0xc) {
      return;
    }
    if (bVar2 != 4) {
      return;
    }
    uVar17 = (bVar14 ^ 1) * 0xa00000 | uVar17 & 0xff | (uVar17 & 0x700) << 4 |
             (uVar17 & 0x800) << 0xf;
    break;
  case 5:
    pAVar7 = (AddressTableEntry *)(ulong)(uVar17 * 2);
  case 6:
    if (bVar2 != 4) {
      return;
    }
    uVar17 = (uint)pAVar7;
    uVar17 = ((uVar17 >> 0x15 ^ ~uVar17 >> 0x17) & 1) << 0xb |
             (((uint)((ulong)pAVar7 >> 0x16) ^ ~uVar17 >> 0x17) & 1) << 0xe |
             ((uVar17 & 0x1ff800) << 5 | uVar17 & 0x7ff) + (uVar17 & 0x800000) * 8;
    break;
  case 7:
    if (bVar3 != 0) {
      return;
    }
    if (bVar1 != 0x14) {
      return;
    }
    if (bVar2 != 4) {
      return;
    }
    uVar17 = ((uVar17 >> 0x15 ^ ~uVar17 >> 0x13) & 1) << 0xb |
             (((uint)((ulong)pAVar7 >> 0x16) ^ ~uVar17 >> 0x13) & 1) << 0xe |
             (uVar17 & 0x80000) << 7 | (uVar17 & 0x1f800) << 5 | uVar17 & 0x7ff;
    break;
  case 8:
    bVar24 = true;
    if (0xff < uVar17) {
      uVar11 = uVar17 << 0x10 | uVar17 >> 0x10;
      if (((ulong)pAVar7 & 0xff0000ff) == 0) {
        uVar11 = uVar17;
      }
      uVar6 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      sVar8 = (sbyte)(uVar6 & 0x1e);
      uVar11 = uVar11 >> sVar8 | uVar11 << 0x20 - sVar8;
      bVar24 = uVar11 < 0x100;
      if (bVar24) {
        uVar17 = ((uint)(((ulong)pAVar7 & 0xff0000ff) != 0) * 0x10 - (uVar6 & 0x1e) & 0x1e) << 7 |
                 uVar11;
        bVar24 = true;
      }
    }
    if (!bVar24) {
      return;
    }
    uVar17 = uVar17 << (bVar3 & 0x1f) | 0x400000 << bVar14;
    break;
  case 9:
    uVar11 = uVar17 << (bVar3 & 0x1f);
    uVar17 = (uint)bVar14 << 0x17;
    goto LAB_0011a2f0;
  case 10:
    if (bVar3 != 0) {
      return;
    }
    if (bVar1 != 8) {
      return;
    }
    if (bVar2 != 4) {
      return;
    }
    uVar11 = (uVar17 & 0xf0) << 4;
    uVar17 = (uint)bVar14 << 0x17 | uVar17 & 0xf;
LAB_0011a2f0:
    uVar17 = uVar17 | uVar11;
    break;
  case 0xb:
    if (bVar3 != 0) {
      return;
    }
    if (bVar1 != 0x19) {
      return;
    }
    if (bVar2 != 4) {
      return;
    }
    uVar17 = uVar17 >> 1 & 0xffffff | (uVar17 & 1) << 0x18;
  }
  *(uint *)this = uVar17;
  return;
}

Assistant:

void insert(NodeT* ASMJIT_NONNULL(node), const CompareT& cmp = CompareT()) noexcept {
    // Node to insert must not contain garbage.
    ASMJIT_ASSERT(!node->hasLeft());
    ASMJIT_ASSERT(!node->hasRight());
    ASMJIT_ASSERT(!node->isRed());

    if (!_root) {
      _root = node;
      return;
    }

    ZoneTreeNode head;           // False root node,
    head._setRight(_root);       // having root on the right.

    ZoneTreeNode* g = nullptr;   // Grandparent.
    ZoneTreeNode* p = nullptr;   // Parent.
    ZoneTreeNode* t = &head;     // Iterator.
    ZoneTreeNode* q = _root;     // Query.

    size_t dir = 0;              // Direction for accessing child nodes.
    size_t last = 0;             // Not needed to initialize, but makes some tools happy.

    node->_makeRed();            // New nodes are always red and violations fixed appropriately.

    // Search down the tree.
    for (;;) {
      if (!q) {
        // Insert new node at the bottom.
        q = node;
        p->_setChild(dir, node);
      }
      else if (_isValidRed(q->_getLeft()) && _isValidRed(q->_getRight())) {
        // Color flip.
        q->_makeRed();
        q->_getLeft()->_makeBlack();
        q->_getRight()->_makeBlack();
      }

      // Fix red violation.
      if (_isValidRed(q) && _isValidRed(p)) {
        ASMJIT_ASSUME(g != nullptr);
        ASMJIT_ASSUME(p != nullptr);
        t->_setChild(t->_getRight() == g,
                     q == p->_getChild(last) ? _singleRotate(g, !last) : _doubleRotate(g, !last));
      }

      // Stop if found.
      if (q == node)
        break;

      last = dir;
      dir = cmp(*static_cast<NodeT*>(q), *static_cast<NodeT*>(node)) < 0;

      // Update helpers.
      if (g) t = g;

      g = p;
      p = q;
      q = q->_getChild(dir);
    }

    // Update root and make it black.
    _root = static_cast<NodeT*>(head._getRight());
    _root->_makeBlack();
  }